

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O0

bool __thiscall
cmAuxSourceDirectoryCommand::InitialPass
          (cmAuxSourceDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  const_reference pvVar5;
  char *pcVar6;
  unsigned_long uVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  const_iterator __first;
  const_iterator __last;
  cmSourceFile *this_00;
  ulong uVar10;
  bool local_251;
  allocator local_1e1;
  string local_1e0;
  cmSourceFile *local_1c0;
  cmSourceFile *sf;
  string fullname;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  string local_178 [8];
  string base;
  string ext;
  size_type dotpos;
  string local_128 [8];
  string file;
  size_t i;
  size_t numfiles;
  string local_f0;
  Directory local_d0;
  Directory dir;
  char *def;
  string tdir;
  string templateDirectory;
  string sourceListValue;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAuxSourceDirectoryCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if ((sVar4 < 2) ||
     (sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local), 2 < sVar4)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)(templateDirectory.field_2._M_local_buf + 8));
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    std::__cxx11::string::string((string *)(tdir.field_2._M_local_buf + 8),(string *)pvVar5);
    std::__cxx11::string::string((string *)&def);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar6);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&def,(string *)(tdir.field_2._M_local_buf + 8));
    }
    else {
      pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::operator=((string *)&def,pcVar6);
      std::__cxx11::string::operator+=((string *)&def,"/");
      std::__cxx11::string::operator+=((string *)&def,(string *)(tdir.field_2._M_local_buf + 8));
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,1);
    dir.Internal = (DirectoryInternals *)cmMakefile::GetDefinition(pcVar1,pvVar5);
    if (dir.Internal != (DirectoryInternals *)0x0) {
      std::__cxx11::string::operator=
                ((string *)(templateDirectory.field_2._M_local_buf + 8),(char *)dir.Internal);
    }
    cmsys::Directory::Directory(&local_d0);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,pcVar6,(allocator *)((long)&numfiles + 7));
    bVar2 = cmsys::Directory::Load(&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&numfiles + 7));
    if (bVar2) {
      uVar7 = cmsys::Directory::GetNumberOfFiles(&local_d0);
      for (file.field_2._8_8_ = 0; (ulong)file.field_2._8_8_ < uVar7;
          file.field_2._8_8_ = file.field_2._8_8_ + 1) {
        pcVar6 = cmsys::Directory::GetFile(&local_d0,file.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_128,pcVar6,(allocator *)((long)&dotpos + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&dotpos + 7));
        lVar8 = std::__cxx11::string::rfind((char *)local_128,0x8d126d);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)((long)&base.field_2 + 8),(ulong)local_128);
          std::__cxx11::string::substr((ulong)local_178,(ulong)local_128);
          uVar3 = std::__cxx11::string::empty();
          local_251 = false;
          if ((uVar3 & 1) == 0) {
            pvVar9 = cmMakefile::GetSourceExtensions_abi_cxx11_((this->super_cmCommand).Makefile);
            __first = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin(pvVar9);
            pvVar9 = cmMakefile::GetSourceExtensions_abi_cxx11_((this->super_cmCommand).Makefile);
            __last = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(pvVar9);
            local_180 = std::
                        find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                  (__first._M_current,__last._M_current,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&base.field_2 + 8));
            pvVar9 = cmMakefile::GetSourceExtensions_abi_cxx11_((this->super_cmCommand).Makefile);
            fullname.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar9);
            local_251 = __gnu_cxx::operator!=
                                  (&local_180,
                                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&fullname.field_2 + 8));
          }
          if (local_251 != false) {
            std::__cxx11::string::string((string *)&sf,(string *)(tdir.field_2._M_local_buf + 8));
            std::__cxx11::string::operator+=((string *)&sf,"/");
            std::__cxx11::string::operator+=((string *)&sf,local_128);
            this_00 = cmMakefile::GetOrCreateSource
                                ((this->super_cmCommand).Makefile,(string *)&sf,false);
            local_1c0 = this_00;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1e0,"ABSTRACT",&local_1e1);
            cmSourceFile::SetProperty(this_00,&local_1e0,"0");
            std::__cxx11::string::~string((string *)&local_1e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              std::__cxx11::string::operator+=
                        ((string *)(templateDirectory.field_2._M_local_buf + 8),";");
            }
            std::__cxx11::string::operator+=
                      ((string *)(templateDirectory.field_2._M_local_buf + 8),(string *)&sf);
            std::__cxx11::string::~string((string *)&sf);
          }
          std::__cxx11::string::~string(local_178);
          std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string(local_128);
      }
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,1);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,pvVar5,pcVar6);
    this_local._7_1_ = 1;
    cmsys::Directory::~Directory(&local_d0);
    std::__cxx11::string::~string((string *)&def);
    std::__cxx11::string::~string((string *)(tdir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(templateDirectory.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAuxSourceDirectoryCommand::InitialPass
(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 || args.size() > 2)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string sourceListValue;
  std::string templateDirectory = args[0];
  std::string tdir;
  if(!cmSystemTools::FileIsFullPath(templateDirectory.c_str()))
    {
    tdir = this->Makefile->GetCurrentSourceDirectory();
    tdir += "/";
    tdir += templateDirectory;
    }
  else
    {
    tdir = templateDirectory;
    }

  // was the list already populated
  const char *def = this->Makefile->GetDefinition(args[1]);
  if (def)
    {
    sourceListValue = def;
    }

  // Load all the files in the directory
  cmsys::Directory dir;
  if(dir.Load(tdir.c_str()))
    {
    size_t numfiles = dir.GetNumberOfFiles();
    for(size_t i =0; i < numfiles; ++i)
      {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind(".");
      if( dotpos != std::string::npos )
        {
        std::string ext = file.substr(dotpos+1);
        std::string base = file.substr(0, dotpos);
        // Process only source files
        if(!base.empty()
            && std::find( this->Makefile->GetSourceExtensions().begin(),
                          this->Makefile->GetSourceExtensions().end(), ext )
                 != this->Makefile->GetSourceExtensions().end() )
          {
          std::string fullname = templateDirectory;
          fullname += "/";
          fullname += file;
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf =
            this->Makefile->GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT","0");
          if(!sourceListValue.empty())
            {
            sourceListValue += ";";
            }
          sourceListValue += fullname;
          }
        }
      }
    }
  this->Makefile->AddDefinition(args[1], sourceListValue.c_str());
  return true;
}